

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

void __thiscall
t_rb_generator::generate_field_defns(t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  pointer pcVar1;
  t_field *ptVar2;
  char *pcVar3;
  long lVar4;
  t_struct *ptVar5;
  ostream *poVar6;
  int iVar7;
  long lVar8;
  t_rb_generator *this_00;
  pointer pptVar9;
  char *local_80;
  long local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  t_rb_generator *local_60;
  t_struct *local_58;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_60 = this;
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar7 = iVar7 + 1;
    } while (iVar7 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"FIELDS = {",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar7 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8;
  *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       iVar7 + 1;
  pptVar9 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = local_60;
  ptVar5 = tstruct;
  if (pptVar9 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_58 = ptVar5;
      if (pptVar9 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
      }
      generate_rdoc(this_00,out,&(*pptVar9)->super_t_doc);
      if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0xf8) {
        iVar7 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
          iVar7 = iVar7 + 1;
        } while (iVar7 < *(int *)&(out->super_ofstream).
                                  super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
      }
      local_80 = &local_70;
      pcVar1 = ((*pptVar9)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar1,pcVar1 + ((*pptVar9)->name_)._M_string_length);
      lVar4 = local_78;
      pcVar3 = local_80;
      if (local_78 != 0) {
        lVar8 = 0;
        do {
          iVar7 = toupper((int)pcVar3[lVar8]);
          pcVar3[lVar8] = (char)iVar7;
          lVar8 = lVar8 + 1;
          this_00 = local_60;
        } while (lVar4 != lVar8);
      }
      lVar4 = local_78;
      if (local_80 == &local_70) {
        uStack_38 = uStack_68;
        local_80 = &local_40;
      }
      _local_40 = CONCAT71(uStack_6f,local_70);
      local_48 = local_78;
      local_78 = 0;
      local_70 = '\0';
      local_50 = local_80;
      local_80 = &local_70;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_50,lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," => ",4);
      tstruct = local_58;
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      ptVar2 = *pptVar9;
      generate_field_data(this_00,out,ptVar2->type_,&ptVar2->name_,ptVar2->value_,
                          ptVar2->req_ == T_OPTIONAL);
      pptVar9 = pptVar9 + 1;
      ptVar5 = local_58;
    } while (pptVar9 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    iVar7 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0xf8 + -1;
  }
  *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       iVar7;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar7 = iVar7 + 1;
    } while (iVar7 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"}",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar7 = iVar7 + 1;
    } while (iVar7 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"def struct_fields; FIELDS; end",0x1e);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_rb_generator::generate_field_defns(t_rb_ofstream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out.indent() << "FIELDS = {" << endl;
  out.indent_up();
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (f_iter != fields.begin()) {
      out << "," << endl;
    }

    // generate the field docstrings within the FIELDS constant. no real better place...
    generate_rdoc(out, *f_iter);

    out.indent() << upcase_string((*f_iter)->get_name()) << " => ";

    generate_field_data(out,
                        (*f_iter)->get_type(),
                        (*f_iter)->get_name(),
                        (*f_iter)->get_value(),
                        (*f_iter)->get_req() == t_field::T_OPTIONAL);
  }
  out.indent_down();
  out << endl;
  out.indent() << "}" << endl << endl;

  out.indent() << "def struct_fields; FIELDS; end" << endl << endl;
}